

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O2

void aom_smooth_v_predictor_64x32_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  undefined1 auVar1 [15];
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  unkuint9 Var28;
  undefined1 auVar29 [11];
  undefined1 auVar30 [13];
  undefined1 auVar31 [15];
  unkuint9 Var32;
  undefined1 auVar33 [11];
  undefined1 auVar34 [15];
  unkuint9 Var35;
  undefined1 auVar36 [11];
  undefined1 auVar37 [13];
  undefined1 auVar38 [15];
  unkuint9 Var39;
  undefined1 auVar40 [11];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  int y_mask;
  uint uVar49;
  uint8_t *puVar50;
  short sVar51;
  short sVar54;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  ushort uVar55;
  ushort uVar56;
  ushort uVar57;
  ushort uVar58;
  ushort uVar59;
  ushort uVar60;
  ushort uVar61;
  ushort uVar62;
  ushort uVar63;
  ushort uVar64;
  ushort uVar65;
  ushort uVar66;
  short sVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  short sVar71;
  short sVar72;
  ushort uVar73;
  short sVar74;
  short sVar75;
  short sVar76;
  short sVar77;
  short sVar78;
  short sVar79;
  ushort uVar80;
  short sVar81;
  short sVar82;
  short sVar83;
  short sVar84;
  short sVar85;
  short sVar86;
  ushort uVar87;
  short sVar88;
  short sVar89;
  short sVar90;
  short sVar91;
  short sVar92;
  short sVar93;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  ushort uVar98;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  ushort uVar99;
  ushort uVar100;
  ushort uVar101;
  ushort uVar103;
  ushort uVar104;
  ushort uVar105;
  ushort uVar106;
  ushort uVar107;
  ushort uVar108;
  ushort uVar109;
  ushort uVar110;
  ushort uVar111;
  ushort uVar112;
  ushort uVar113;
  ushort uVar114;
  ushort uVar115;
  ushort uVar116;
  ushort uVar117;
  undefined1 auVar102 [16];
  short sVar118;
  short sVar119;
  short sVar122;
  short sVar123;
  short sVar124;
  short sVar125;
  short sVar126;
  short sVar127;
  short sVar128;
  short sVar129;
  short sVar130;
  short sVar131;
  short sVar132;
  short sVar133;
  undefined1 auVar120 [16];
  short sVar134;
  undefined1 auVar121 [16];
  short sVar135;
  ushort uVar136;
  ushort uVar137;
  ushort uVar138;
  ushort uVar139;
  ushort uVar140;
  ushort uVar141;
  ushort uVar142;
  ushort uVar143;
  ushort uVar144;
  ushort uVar145;
  ushort uVar146;
  ushort uVar147;
  ushort uVar148;
  ushort uVar149;
  ushort uVar150;
  ushort uVar151;
  ushort uVar152;
  ushort uVar153;
  ushort uVar154;
  ushort uVar155;
  ushort uVar156;
  ushort uVar157;
  ushort uVar158;
  ushort uVar159;
  ushort uVar160;
  ushort uVar161;
  ushort uVar162;
  ushort uVar163;
  ushort uVar164;
  ushort uVar165;
  ushort uVar166;
  ushort uVar167;
  ushort uVar168;
  ushort uVar169;
  ushort uVar170;
  ushort uVar171;
  ushort uVar172;
  ushort uVar173;
  
  auVar53 = _DAT_0046db10;
  auVar52 = pshuflw(ZEXT116(left_column[0x1f]),ZEXT116(left_column[0x1f]),0);
  auVar97 = *(undefined1 (*) [16])top_row;
  auVar102 = *(undefined1 (*) [16])(top_row + 0x10);
  auVar121 = *(undefined1 (*) [16])(top_row + 0x20);
  auVar95 = *(undefined1 (*) [16])(top_row + 0x30);
  auVar4[0xd] = 0;
  auVar4._0_13_ = auVar97._0_13_;
  auVar4[0xe] = auVar97[7];
  auVar8[0xc] = auVar97[6];
  auVar8._0_12_ = auVar97._0_12_;
  auVar8._13_2_ = auVar4._13_2_;
  auVar12[0xb] = 0;
  auVar12._0_11_ = auVar97._0_11_;
  auVar12._12_3_ = auVar8._12_3_;
  auVar16[10] = auVar97[5];
  auVar16._0_10_ = auVar97._0_10_;
  auVar16._11_4_ = auVar12._11_4_;
  auVar20[9] = 0;
  auVar20._0_9_ = auVar97._0_9_;
  auVar20._10_5_ = auVar16._10_5_;
  auVar24[8] = auVar97[4];
  auVar24._0_8_ = auVar97._0_8_;
  auVar24._9_6_ = auVar20._9_6_;
  auVar27._7_8_ = 0;
  auVar27._0_7_ = auVar24._8_7_;
  Var28 = CONCAT81(SUB158(auVar27 << 0x40,7),auVar97[3]);
  auVar41._9_6_ = 0;
  auVar41._0_9_ = Var28;
  auVar29._1_10_ = SUB1510(auVar41 << 0x30,5);
  auVar29[0] = auVar97[2];
  auVar42._11_4_ = 0;
  auVar42._0_11_ = auVar29;
  auVar30._1_12_ = SUB1512(auVar42 << 0x20,3);
  auVar30[0] = auVar97[1];
  uVar66 = (ushort)auVar97[0];
  uVar55 = (ushort)auVar97[8];
  auVar1[0xd] = 0;
  auVar1._0_13_ = auVar102._0_13_;
  auVar1[0xe] = auVar102[7];
  auVar5[0xc] = auVar102[6];
  auVar5._0_12_ = auVar102._0_12_;
  auVar5._13_2_ = auVar1._13_2_;
  auVar9[0xb] = 0;
  auVar9._0_11_ = auVar102._0_11_;
  auVar9._12_3_ = auVar5._12_3_;
  auVar13[10] = auVar102[5];
  auVar13._0_10_ = auVar102._0_10_;
  auVar13._11_4_ = auVar9._11_4_;
  auVar17[9] = 0;
  auVar17._0_9_ = auVar102._0_9_;
  auVar17._10_5_ = auVar13._10_5_;
  auVar21[8] = auVar102[4];
  auVar21._0_8_ = auVar102._0_8_;
  auVar21._9_6_ = auVar17._9_6_;
  auVar31._7_8_ = 0;
  auVar31._0_7_ = auVar21._8_7_;
  Var32 = CONCAT81(SUB158(auVar31 << 0x40,7),auVar102[3]);
  auVar43._9_6_ = 0;
  auVar43._0_9_ = Var32;
  auVar33._1_10_ = SUB1510(auVar43 << 0x30,5);
  auVar33[0] = auVar102[2];
  auVar44._11_4_ = 0;
  auVar44._0_11_ = auVar33;
  auVar25[2] = auVar102[1];
  auVar25._0_2_ = auVar102._0_2_;
  auVar25._3_12_ = SUB1512(auVar44 << 0x20,3);
  uVar73 = auVar102._0_2_ & 0xff;
  uVar56 = (ushort)auVar102[8];
  auVar2[0xd] = 0;
  auVar2._0_13_ = auVar121._0_13_;
  auVar2[0xe] = auVar121[7];
  auVar6[0xc] = auVar121[6];
  auVar6._0_12_ = auVar121._0_12_;
  auVar6._13_2_ = auVar2._13_2_;
  auVar10[0xb] = 0;
  auVar10._0_11_ = auVar121._0_11_;
  auVar10._12_3_ = auVar6._12_3_;
  auVar14[10] = auVar121[5];
  auVar14._0_10_ = auVar121._0_10_;
  auVar14._11_4_ = auVar10._11_4_;
  auVar18[9] = 0;
  auVar18._0_9_ = auVar121._0_9_;
  auVar18._10_5_ = auVar14._10_5_;
  auVar22[8] = auVar121[4];
  auVar22._0_8_ = auVar121._0_8_;
  auVar22._9_6_ = auVar18._9_6_;
  auVar34._7_8_ = 0;
  auVar34._0_7_ = auVar22._8_7_;
  Var35 = CONCAT81(SUB158(auVar34 << 0x40,7),auVar121[3]);
  auVar45._9_6_ = 0;
  auVar45._0_9_ = Var35;
  auVar36._1_10_ = SUB1510(auVar45 << 0x30,5);
  auVar36[0] = auVar121[2];
  auVar46._11_4_ = 0;
  auVar46._0_11_ = auVar36;
  auVar37._1_12_ = SUB1512(auVar46 << 0x20,3);
  auVar37[0] = auVar121[1];
  uVar80 = (ushort)auVar121[0];
  uVar57 = (ushort)auVar121[8];
  auVar3[0xd] = 0;
  auVar3._0_13_ = auVar95._0_13_;
  auVar3[0xe] = auVar95[7];
  auVar7[0xc] = auVar95[6];
  auVar7._0_12_ = auVar95._0_12_;
  auVar7._13_2_ = auVar3._13_2_;
  auVar11[0xb] = 0;
  auVar11._0_11_ = auVar95._0_11_;
  auVar11._12_3_ = auVar7._12_3_;
  auVar15[10] = auVar95[5];
  auVar15._0_10_ = auVar95._0_10_;
  auVar15._11_4_ = auVar11._11_4_;
  auVar19[9] = 0;
  auVar19._0_9_ = auVar95._0_9_;
  auVar19._10_5_ = auVar15._10_5_;
  auVar23[8] = auVar95[4];
  auVar23._0_8_ = auVar95._0_8_;
  auVar23._9_6_ = auVar19._9_6_;
  auVar38._7_8_ = 0;
  auVar38._0_7_ = auVar23._8_7_;
  Var39 = CONCAT81(SUB158(auVar38 << 0x40,7),auVar95[3]);
  auVar47._9_6_ = 0;
  auVar47._0_9_ = Var39;
  auVar40._1_10_ = SUB1510(auVar47 << 0x30,5);
  auVar40[0] = auVar95[2];
  auVar48._11_4_ = 0;
  auVar48._0_11_ = auVar40;
  auVar26[2] = auVar95[1];
  auVar26._0_2_ = auVar95._0_2_;
  auVar26._3_12_ = SUB1512(auVar48 << 0x20,3);
  uVar87 = auVar95._0_2_ & 0xff;
  uVar58 = (ushort)auVar95[8];
  sVar51 = auVar52._0_2_;
  sVar54 = auVar52._2_2_;
  auVar94._2_2_ = sVar54 * 0x10;
  auVar94._0_2_ = sVar51;
  auVar94._4_2_ = sVar51 * 0x1f;
  auVar94._6_2_ = sVar54 * 0x2e;
  auVar94._8_2_ = sVar51 * 0x3c;
  auVar94._10_2_ = sVar54 * 0x4a;
  auVar94._12_2_ = sVar51 * 0x57;
  auVar94._14_2_ = sVar54 * 99;
  auVar52._0_2_ = sVar51 * 0xbe;
  auVar52._2_2_ = sVar54 * 0xc5;
  auVar52._4_2_ = sVar51 * 0xcc;
  auVar52._6_2_ = sVar54 * 0xd3;
  auVar52._8_2_ = sVar51 * 0xd9;
  auVar52._10_2_ = sVar54 * 0xde;
  auVar52._12_2_ = sVar51 * 0xe3;
  auVar52._14_2_ = sVar54 * 0xe7;
  puVar50 = dst + 0x30;
  uVar49 = 0x1000100;
  while( true ) {
    auVar96 = _DAT_0046db30;
    sVar67 = auVar30._0_2_;
    sVar68 = auVar29._0_2_;
    sVar69 = (short)Var28;
    sVar70 = auVar24._8_2_;
    sVar71 = auVar16._10_2_;
    sVar72 = auVar8._12_2_;
    uVar99 = auVar4._13_2_ >> 8;
    uVar100 = (ushort)auVar97[9];
    uVar104 = (ushort)auVar97[10];
    uVar107 = (ushort)auVar97[0xb];
    uVar109 = (ushort)auVar97[0xc];
    uVar111 = (ushort)auVar97[0xd];
    uVar113 = (ushort)auVar97[0xe];
    uVar115 = (ushort)auVar97[0xf];
    sVar74 = auVar25._2_2_;
    sVar75 = auVar33._0_2_;
    sVar76 = (short)Var32;
    sVar77 = auVar21._8_2_;
    sVar78 = auVar13._10_2_;
    sVar79 = auVar5._12_2_;
    uVar101 = auVar1._13_2_ >> 8;
    uVar138 = (ushort)auVar102[9];
    uVar142 = (ushort)auVar102[10];
    uVar146 = (ushort)auVar102[0xb];
    uVar150 = (ushort)auVar102[0xc];
    uVar154 = (ushort)auVar102[0xd];
    uVar160 = (ushort)auVar102[0xe];
    uVar166 = (ushort)auVar102[0xf];
    sVar81 = auVar37._0_2_;
    sVar82 = auVar36._0_2_;
    sVar83 = (short)Var35;
    sVar84 = auVar22._8_2_;
    sVar85 = auVar14._10_2_;
    sVar86 = auVar6._12_2_;
    uVar105 = auVar2._13_2_ >> 8;
    uVar139 = (ushort)auVar121[9];
    uVar143 = (ushort)auVar121[10];
    uVar147 = (ushort)auVar121[0xb];
    uVar151 = (ushort)auVar121[0xc];
    uVar155 = (ushort)auVar121[0xd];
    uVar161 = (ushort)auVar121[0xe];
    uVar167 = (ushort)auVar121[0xf];
    sVar88 = auVar26._2_2_;
    sVar89 = auVar40._0_2_;
    sVar90 = (short)Var39;
    sVar91 = auVar23._8_2_;
    sVar92 = auVar15._10_2_;
    sVar93 = auVar7._12_2_;
    uVar98 = auVar3._13_2_ >> 8;
    uVar59 = (ushort)auVar95[9];
    uVar60 = (ushort)auVar95[10];
    uVar61 = (ushort)auVar95[0xb];
    uVar62 = (ushort)auVar95[0xc];
    uVar63 = (ushort)auVar95[0xd];
    uVar64 = (ushort)auVar95[0xe];
    uVar65 = (ushort)auVar95[0xf];
    if (0xf0e0f0e < uVar49) break;
    auVar120._4_4_ = uVar49;
    auVar120._0_4_ = uVar49;
    auVar120._8_4_ = uVar49;
    auVar120._12_4_ = uVar49;
    auVar96 = pshufb(auVar53,auVar120);
    auVar120 = pshufb(auVar94,auVar120);
    sVar119 = auVar96._0_2_;
    sVar123 = auVar96._2_2_;
    sVar125 = auVar96._4_2_;
    sVar127 = auVar96._6_2_;
    sVar129 = auVar96._8_2_;
    sVar131 = auVar96._10_2_;
    sVar133 = auVar96._12_2_;
    sVar135 = auVar96._14_2_;
    sVar118 = auVar120._0_2_ + 0x80;
    sVar122 = auVar120._2_2_ + 0x80;
    sVar124 = auVar120._4_2_ + 0x80;
    sVar126 = auVar120._6_2_ + 0x80;
    sVar128 = auVar120._8_2_ + 0x80;
    sVar130 = auVar120._10_2_ + 0x80;
    sVar132 = auVar120._12_2_ + 0x80;
    sVar134 = auVar120._14_2_ + 0x80;
    uVar136 = sVar119 * uVar66 + sVar118;
    uVar140 = sVar123 * sVar67 + sVar122;
    uVar144 = sVar125 * sVar68 + sVar124;
    uVar148 = sVar127 * sVar69 + sVar126;
    uVar152 = sVar129 * sVar70 + sVar128;
    uVar158 = sVar131 * sVar71 + sVar130;
    uVar164 = sVar133 * sVar72 + sVar132;
    uVar170 = sVar135 * uVar99 + sVar134;
    uVar137 = uVar136 >> 8;
    uVar141 = uVar140 >> 8;
    uVar145 = uVar144 >> 8;
    uVar149 = uVar148 >> 8;
    uVar153 = uVar152 >> 8;
    uVar159 = uVar158 >> 8;
    uVar165 = uVar164 >> 8;
    uVar171 = uVar170 >> 8;
    uVar99 = sVar119 * uVar55 + sVar118;
    uVar103 = sVar123 * uVar100 + sVar122;
    uVar106 = sVar125 * uVar104 + sVar124;
    uVar108 = sVar127 * uVar107 + sVar126;
    uVar110 = sVar129 * uVar109 + sVar128;
    uVar112 = sVar131 * uVar111 + sVar130;
    uVar114 = sVar133 * uVar113 + sVar132;
    uVar116 = sVar135 * uVar115 + sVar134;
    uVar100 = uVar99 >> 8;
    uVar104 = uVar103 >> 8;
    uVar107 = uVar106 >> 8;
    uVar109 = uVar108 >> 8;
    uVar111 = uVar110 >> 8;
    uVar113 = uVar112 >> 8;
    uVar115 = uVar114 >> 8;
    uVar117 = uVar116 >> 8;
    puVar50[-0x30] = (uVar137 != 0) * (uVar137 < 0x100) * (char)(uVar136 >> 8) - (0xff < uVar137);
    puVar50[-0x2f] = (uVar141 != 0) * (uVar141 < 0x100) * (char)(uVar140 >> 8) - (0xff < uVar141);
    puVar50[-0x2e] = (uVar145 != 0) * (uVar145 < 0x100) * (char)(uVar144 >> 8) - (0xff < uVar145);
    puVar50[-0x2d] = (uVar149 != 0) * (uVar149 < 0x100) * (char)(uVar148 >> 8) - (0xff < uVar149);
    puVar50[-0x2c] = (uVar153 != 0) * (uVar153 < 0x100) * (char)(uVar152 >> 8) - (0xff < uVar153);
    puVar50[-0x2b] = (uVar159 != 0) * (uVar159 < 0x100) * (char)(uVar158 >> 8) - (0xff < uVar159);
    puVar50[-0x2a] = (uVar165 != 0) * (uVar165 < 0x100) * (char)(uVar164 >> 8) - (0xff < uVar165);
    puVar50[-0x29] = (uVar171 != 0) * (uVar171 < 0x100) * (char)(uVar170 >> 8) - (0xff < uVar171);
    puVar50[-0x28] = (uVar100 != 0) * (uVar100 < 0x100) * (char)(uVar99 >> 8) - (0xff < uVar100);
    puVar50[-0x27] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar104);
    puVar50[-0x26] = (uVar107 != 0) * (uVar107 < 0x100) * (char)(uVar106 >> 8) - (0xff < uVar107);
    puVar50[-0x25] = (uVar109 != 0) * (uVar109 < 0x100) * (char)(uVar108 >> 8) - (0xff < uVar109);
    puVar50[-0x24] = (uVar111 != 0) * (uVar111 < 0x100) * (char)(uVar110 >> 8) - (0xff < uVar111);
    puVar50[-0x23] = (uVar113 != 0) * (uVar113 < 0x100) * (char)(uVar112 >> 8) - (0xff < uVar113);
    puVar50[-0x22] = (uVar115 != 0) * (uVar115 < 0x100) * (char)(uVar114 >> 8) - (0xff < uVar115);
    puVar50[-0x21] = (uVar117 != 0) * (uVar117 < 0x100) * (char)(uVar116 >> 8) - (0xff < uVar117);
    uVar99 = sVar119 * uVar73 + sVar118;
    uVar100 = sVar123 * sVar74 + sVar122;
    uVar107 = sVar125 * sVar75 + sVar124;
    uVar111 = sVar127 * sVar76 + sVar126;
    uVar115 = sVar129 * sVar77 + sVar128;
    uVar106 = sVar131 * sVar78 + sVar130;
    uVar110 = sVar133 * sVar79 + sVar132;
    uVar114 = sVar135 * uVar101 + sVar134;
    uVar101 = uVar99 >> 8;
    uVar104 = uVar100 >> 8;
    uVar109 = uVar107 >> 8;
    uVar113 = uVar111 >> 8;
    uVar103 = uVar115 >> 8;
    uVar108 = uVar106 >> 8;
    uVar112 = uVar110 >> 8;
    uVar116 = uVar114 >> 8;
    uVar117 = sVar119 * uVar56 + sVar118;
    uVar136 = sVar123 * uVar138 + sVar122;
    uVar137 = sVar125 * uVar142 + sVar124;
    uVar140 = sVar127 * uVar146 + sVar126;
    uVar141 = sVar129 * uVar150 + sVar128;
    uVar144 = sVar131 * uVar154 + sVar130;
    uVar145 = sVar133 * uVar160 + sVar132;
    uVar148 = sVar135 * uVar166 + sVar134;
    uVar138 = uVar117 >> 8;
    uVar142 = uVar136 >> 8;
    uVar146 = uVar137 >> 8;
    uVar150 = uVar140 >> 8;
    uVar154 = uVar141 >> 8;
    uVar160 = uVar144 >> 8;
    uVar166 = uVar145 >> 8;
    uVar149 = uVar148 >> 8;
    puVar50[-0x20] = (uVar101 != 0) * (uVar101 < 0x100) * (char)(uVar99 >> 8) - (0xff < uVar101);
    puVar50[-0x1f] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar100 >> 8) - (0xff < uVar104);
    puVar50[-0x1e] = (uVar109 != 0) * (uVar109 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar109);
    puVar50[-0x1d] = (uVar113 != 0) * (uVar113 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar113);
    puVar50[-0x1c] = (uVar103 != 0) * (uVar103 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar103);
    puVar50[-0x1b] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar106 >> 8) - (0xff < uVar108);
    puVar50[-0x1a] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar110 >> 8) - (0xff < uVar112);
    puVar50[-0x19] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar114 >> 8) - (0xff < uVar116);
    puVar50[-0x18] = (uVar138 != 0) * (uVar138 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar138);
    puVar50[-0x17] = (uVar142 != 0) * (uVar142 < 0x100) * (char)(uVar136 >> 8) - (0xff < uVar142);
    puVar50[-0x16] = (uVar146 != 0) * (uVar146 < 0x100) * (char)(uVar137 >> 8) - (0xff < uVar146);
    puVar50[-0x15] = (uVar150 != 0) * (uVar150 < 0x100) * (char)(uVar140 >> 8) - (0xff < uVar150);
    puVar50[-0x14] = (uVar154 != 0) * (uVar154 < 0x100) * (char)(uVar141 >> 8) - (0xff < uVar154);
    puVar50[-0x13] = (uVar160 != 0) * (uVar160 < 0x100) * (char)(uVar144 >> 8) - (0xff < uVar160);
    puVar50[-0x12] = (uVar166 != 0) * (uVar166 < 0x100) * (char)(uVar145 >> 8) - (0xff < uVar166);
    puVar50[-0x11] = (uVar149 != 0) * (uVar149 < 0x100) * (char)(uVar148 >> 8) - (0xff < uVar149);
    uVar99 = sVar119 * uVar80 + sVar118;
    uVar100 = sVar123 * sVar81 + sVar122;
    uVar104 = sVar125 * sVar82 + sVar124;
    uVar109 = sVar127 * sVar83 + sVar126;
    uVar113 = sVar129 * sVar84 + sVar128;
    uVar138 = sVar131 * sVar85 + sVar130;
    uVar146 = sVar133 * sVar86 + sVar132;
    uVar154 = sVar135 * uVar105 + sVar134;
    uVar101 = uVar99 >> 8;
    uVar105 = uVar100 >> 8;
    uVar107 = uVar104 >> 8;
    uVar111 = uVar109 >> 8;
    uVar115 = uVar113 >> 8;
    uVar142 = uVar138 >> 8;
    uVar150 = uVar146 >> 8;
    uVar160 = uVar154 >> 8;
    uVar166 = sVar119 * uVar57 + sVar118;
    uVar103 = sVar123 * uVar139 + sVar122;
    uVar106 = sVar125 * uVar143 + sVar124;
    uVar108 = sVar127 * uVar147 + sVar126;
    uVar110 = sVar129 * uVar151 + sVar128;
    uVar112 = sVar131 * uVar155 + sVar130;
    uVar114 = sVar133 * uVar161 + sVar132;
    uVar116 = sVar135 * uVar167 + sVar134;
    uVar139 = uVar166 >> 8;
    uVar143 = uVar103 >> 8;
    uVar147 = uVar106 >> 8;
    uVar151 = uVar108 >> 8;
    uVar155 = uVar110 >> 8;
    uVar161 = uVar112 >> 8;
    uVar167 = uVar114 >> 8;
    uVar117 = uVar116 >> 8;
    puVar50[-0x10] = (uVar101 != 0) * (uVar101 < 0x100) * (char)(uVar99 >> 8) - (0xff < uVar101);
    puVar50[-0xf] = (uVar105 != 0) * (uVar105 < 0x100) * (char)(uVar100 >> 8) - (0xff < uVar105);
    puVar50[-0xe] = (uVar107 != 0) * (uVar107 < 0x100) * (char)(uVar104 >> 8) - (0xff < uVar107);
    puVar50[-0xd] = (uVar111 != 0) * (uVar111 < 0x100) * (char)(uVar109 >> 8) - (0xff < uVar111);
    puVar50[-0xc] = (uVar115 != 0) * (uVar115 < 0x100) * (char)(uVar113 >> 8) - (0xff < uVar115);
    puVar50[-0xb] = (uVar142 != 0) * (uVar142 < 0x100) * (char)(uVar138 >> 8) - (0xff < uVar142);
    puVar50[-10] = (uVar150 != 0) * (uVar150 < 0x100) * (char)(uVar146 >> 8) - (0xff < uVar150);
    puVar50[-9] = (uVar160 != 0) * (uVar160 < 0x100) * (char)(uVar154 >> 8) - (0xff < uVar160);
    puVar50[-8] = (uVar139 != 0) * (uVar139 < 0x100) * (char)(uVar166 >> 8) - (0xff < uVar139);
    puVar50[-7] = (uVar143 != 0) * (uVar143 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar143);
    puVar50[-6] = (uVar147 != 0) * (uVar147 < 0x100) * (char)(uVar106 >> 8) - (0xff < uVar147);
    puVar50[-5] = (uVar151 != 0) * (uVar151 < 0x100) * (char)(uVar108 >> 8) - (0xff < uVar151);
    puVar50[-4] = (uVar155 != 0) * (uVar155 < 0x100) * (char)(uVar110 >> 8) - (0xff < uVar155);
    puVar50[-3] = (uVar161 != 0) * (uVar161 < 0x100) * (char)(uVar112 >> 8) - (0xff < uVar161);
    puVar50[-2] = (uVar167 != 0) * (uVar167 < 0x100) * (char)(uVar114 >> 8) - (0xff < uVar167);
    puVar50[-1] = (uVar117 != 0) * (uVar117 < 0x100) * (char)(uVar116 >> 8) - (0xff < uVar117);
    uVar160 = sVar119 * uVar87 + sVar118;
    uVar139 = sVar123 * sVar88 + sVar122;
    uVar147 = sVar125 * sVar89 + sVar124;
    uVar155 = sVar127 * sVar90 + sVar126;
    uVar167 = sVar129 * sVar91 + sVar128;
    uVar106 = sVar131 * sVar92 + sVar130;
    uVar110 = sVar133 * sVar93 + sVar132;
    uVar114 = sVar135 * uVar98 + sVar134;
    uVar166 = uVar160 >> 8;
    uVar143 = uVar139 >> 8;
    uVar151 = uVar147 >> 8;
    uVar161 = uVar155 >> 8;
    uVar103 = uVar167 >> 8;
    uVar108 = uVar106 >> 8;
    uVar112 = uVar110 >> 8;
    uVar116 = uVar114 >> 8;
    uVar99 = sVar119 * uVar58 + sVar118;
    uVar105 = sVar123 * uVar59 + sVar122;
    uVar100 = sVar125 * uVar60 + sVar124;
    uVar107 = sVar127 * uVar61 + sVar126;
    uVar111 = sVar129 * uVar62 + sVar128;
    uVar115 = sVar131 * uVar63 + sVar130;
    uVar142 = sVar133 * uVar64 + sVar132;
    uVar150 = sVar135 * uVar65 + sVar134;
    uVar101 = uVar99 >> 8;
    uVar98 = uVar105 >> 8;
    uVar104 = uVar100 >> 8;
    uVar109 = uVar107 >> 8;
    uVar113 = uVar111 >> 8;
    uVar138 = uVar115 >> 8;
    uVar146 = uVar142 >> 8;
    uVar154 = uVar150 >> 8;
    *puVar50 = (uVar166 != 0) * (uVar166 < 0x100) * (char)(uVar160 >> 8) - (0xff < uVar166);
    puVar50[1] = (uVar143 != 0) * (uVar143 < 0x100) * (char)(uVar139 >> 8) - (0xff < uVar143);
    puVar50[2] = (uVar151 != 0) * (uVar151 < 0x100) * (char)(uVar147 >> 8) - (0xff < uVar151);
    puVar50[3] = (uVar161 != 0) * (uVar161 < 0x100) * (char)(uVar155 >> 8) - (0xff < uVar161);
    puVar50[4] = (uVar103 != 0) * (uVar103 < 0x100) * (char)(uVar167 >> 8) - (0xff < uVar103);
    puVar50[5] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar106 >> 8) - (0xff < uVar108);
    puVar50[6] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar110 >> 8) - (0xff < uVar112);
    puVar50[7] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar114 >> 8) - (0xff < uVar116);
    puVar50[8] = (uVar101 != 0) * (uVar101 < 0x100) * (char)(uVar99 >> 8) - (0xff < uVar101);
    puVar50[9] = (uVar98 != 0) * (uVar98 < 0x100) * (char)(uVar105 >> 8) - (0xff < uVar98);
    puVar50[10] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar100 >> 8) - (0xff < uVar104);
    puVar50[0xb] = (uVar109 != 0) * (uVar109 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar109);
    puVar50[0xc] = (uVar113 != 0) * (uVar113 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar113);
    puVar50[0xd] = (uVar138 != 0) * (uVar138 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar138);
    puVar50[0xe] = (uVar146 != 0) * (uVar146 < 0x100) * (char)(uVar142 >> 8) - (0xff < uVar146);
    puVar50[0xf] = (uVar154 != 0) * (uVar154 < 0x100) * (char)(uVar150 >> 8) - (0xff < uVar154);
    uVar49 = uVar49 + 0x2020202;
    puVar50 = puVar50 + stride;
  }
  auVar97._0_2_ = sVar51 * 0x6f;
  auVar97._2_2_ = sVar54 * 0x7b;
  auVar97._4_2_ = sVar51 * 0x86;
  auVar97._6_2_ = sVar54 * 0x91;
  auVar97._8_2_ = sVar51 * 0x9b;
  auVar97._10_2_ = sVar54 * 0xa4;
  auVar97._12_2_ = sVar51 * 0xad;
  auVar97._14_2_ = sVar54 * 0xb6;
  for (uVar49 = 0x1000100; auVar102 = _DAT_0046db50, uVar49 < 0xf0e0f0f; uVar49 = uVar49 + 0x2020202
      ) {
    auVar53._4_4_ = uVar49;
    auVar53._0_4_ = uVar49;
    auVar53._8_4_ = uVar49;
    auVar53._12_4_ = uVar49;
    auVar102 = pshufb(auVar96,auVar53);
    auVar121 = pshufb(auVar97,auVar53);
    sVar118 = auVar102._0_2_;
    sVar122 = auVar102._2_2_;
    sVar124 = auVar102._4_2_;
    sVar126 = auVar102._6_2_;
    sVar128 = auVar102._8_2_;
    sVar130 = auVar102._10_2_;
    sVar132 = auVar102._12_2_;
    sVar134 = auVar102._14_2_;
    sVar119 = auVar121._0_2_ + 0x80;
    sVar123 = auVar121._2_2_ + 0x80;
    sVar125 = auVar121._4_2_ + 0x80;
    sVar127 = auVar121._6_2_ + 0x80;
    sVar129 = auVar121._8_2_ + 0x80;
    sVar131 = auVar121._10_2_ + 0x80;
    sVar133 = auVar121._12_2_ + 0x80;
    sVar135 = auVar121._14_2_ + 0x80;
    uVar103 = sVar118 * uVar66 + sVar119;
    uVar108 = sVar122 * sVar67 + sVar123;
    uVar112 = sVar124 * sVar68 + sVar125;
    uVar116 = sVar126 * sVar69 + sVar127;
    uVar136 = sVar128 * sVar70 + sVar129;
    uVar140 = sVar130 * sVar71 + sVar131;
    uVar144 = sVar132 * sVar72 + sVar133;
    uVar148 = sVar134 * uVar99 + sVar135;
    uVar106 = uVar103 >> 8;
    uVar110 = uVar108 >> 8;
    uVar114 = uVar112 >> 8;
    uVar117 = uVar116 >> 8;
    uVar137 = uVar136 >> 8;
    uVar141 = uVar140 >> 8;
    uVar145 = uVar144 >> 8;
    uVar149 = uVar148 >> 8;
    uVar152 = sVar118 * uVar55 + sVar119;
    uVar158 = sVar122 * uVar100 + sVar123;
    uVar164 = sVar124 * uVar104 + sVar125;
    uVar170 = sVar126 * uVar107 + sVar127;
    uVar156 = sVar128 * uVar109 + sVar129;
    uVar162 = sVar130 * uVar111 + sVar131;
    uVar168 = sVar132 * uVar113 + sVar133;
    uVar172 = sVar134 * uVar115 + sVar135;
    uVar153 = uVar152 >> 8;
    uVar159 = uVar158 >> 8;
    uVar165 = uVar164 >> 8;
    uVar171 = uVar170 >> 8;
    uVar157 = uVar156 >> 8;
    uVar163 = uVar162 >> 8;
    uVar169 = uVar168 >> 8;
    uVar173 = uVar172 >> 8;
    puVar50[-0x30] = (uVar106 != 0) * (uVar106 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar106);
    puVar50[-0x2f] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar108 >> 8) - (0xff < uVar110);
    puVar50[-0x2e] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar112 >> 8) - (0xff < uVar114);
    puVar50[-0x2d] = (uVar117 != 0) * (uVar117 < 0x100) * (char)(uVar116 >> 8) - (0xff < uVar117);
    puVar50[-0x2c] = (uVar137 != 0) * (uVar137 < 0x100) * (char)(uVar136 >> 8) - (0xff < uVar137);
    puVar50[-0x2b] = (uVar141 != 0) * (uVar141 < 0x100) * (char)(uVar140 >> 8) - (0xff < uVar141);
    puVar50[-0x2a] = (uVar145 != 0) * (uVar145 < 0x100) * (char)(uVar144 >> 8) - (0xff < uVar145);
    puVar50[-0x29] = (uVar149 != 0) * (uVar149 < 0x100) * (char)(uVar148 >> 8) - (0xff < uVar149);
    puVar50[-0x28] = (uVar153 != 0) * (uVar153 < 0x100) * (char)(uVar152 >> 8) - (0xff < uVar153);
    puVar50[-0x27] = (uVar159 != 0) * (uVar159 < 0x100) * (char)(uVar158 >> 8) - (0xff < uVar159);
    puVar50[-0x26] = (uVar165 != 0) * (uVar165 < 0x100) * (char)(uVar164 >> 8) - (0xff < uVar165);
    puVar50[-0x25] = (uVar171 != 0) * (uVar171 < 0x100) * (char)(uVar170 >> 8) - (0xff < uVar171);
    puVar50[-0x24] = (uVar157 != 0) * (uVar157 < 0x100) * (char)(uVar156 >> 8) - (0xff < uVar157);
    puVar50[-0x23] = (uVar163 != 0) * (uVar163 < 0x100) * (char)(uVar162 >> 8) - (0xff < uVar163);
    puVar50[-0x22] = (uVar169 != 0) * (uVar169 < 0x100) * (char)(uVar168 >> 8) - (0xff < uVar169);
    puVar50[-0x21] = (uVar173 != 0) * (uVar173 < 0x100) * (char)(uVar172 >> 8) - (0xff < uVar173);
    uVar103 = sVar118 * uVar73 + sVar119;
    uVar108 = sVar122 * sVar74 + sVar123;
    uVar112 = sVar124 * sVar75 + sVar125;
    uVar116 = sVar126 * sVar76 + sVar127;
    uVar136 = sVar128 * sVar77 + sVar129;
    uVar140 = sVar130 * sVar78 + sVar131;
    uVar144 = sVar132 * sVar79 + sVar133;
    uVar148 = sVar134 * uVar101 + sVar135;
    uVar106 = uVar103 >> 8;
    uVar110 = uVar108 >> 8;
    uVar114 = uVar112 >> 8;
    uVar117 = uVar116 >> 8;
    uVar137 = uVar136 >> 8;
    uVar141 = uVar140 >> 8;
    uVar145 = uVar144 >> 8;
    uVar149 = uVar148 >> 8;
    uVar152 = sVar118 * uVar56 + sVar119;
    uVar158 = sVar122 * uVar138 + sVar123;
    uVar164 = sVar124 * uVar142 + sVar125;
    uVar170 = sVar126 * uVar146 + sVar127;
    uVar156 = sVar128 * uVar150 + sVar129;
    uVar162 = sVar130 * uVar154 + sVar131;
    uVar168 = sVar132 * uVar160 + sVar133;
    uVar172 = sVar134 * uVar166 + sVar135;
    uVar153 = uVar152 >> 8;
    uVar159 = uVar158 >> 8;
    uVar165 = uVar164 >> 8;
    uVar171 = uVar170 >> 8;
    uVar157 = uVar156 >> 8;
    uVar163 = uVar162 >> 8;
    uVar169 = uVar168 >> 8;
    uVar173 = uVar172 >> 8;
    puVar50[-0x20] = (uVar106 != 0) * (uVar106 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar106);
    puVar50[-0x1f] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar108 >> 8) - (0xff < uVar110);
    puVar50[-0x1e] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar112 >> 8) - (0xff < uVar114);
    puVar50[-0x1d] = (uVar117 != 0) * (uVar117 < 0x100) * (char)(uVar116 >> 8) - (0xff < uVar117);
    puVar50[-0x1c] = (uVar137 != 0) * (uVar137 < 0x100) * (char)(uVar136 >> 8) - (0xff < uVar137);
    puVar50[-0x1b] = (uVar141 != 0) * (uVar141 < 0x100) * (char)(uVar140 >> 8) - (0xff < uVar141);
    puVar50[-0x1a] = (uVar145 != 0) * (uVar145 < 0x100) * (char)(uVar144 >> 8) - (0xff < uVar145);
    puVar50[-0x19] = (uVar149 != 0) * (uVar149 < 0x100) * (char)(uVar148 >> 8) - (0xff < uVar149);
    puVar50[-0x18] = (uVar153 != 0) * (uVar153 < 0x100) * (char)(uVar152 >> 8) - (0xff < uVar153);
    puVar50[-0x17] = (uVar159 != 0) * (uVar159 < 0x100) * (char)(uVar158 >> 8) - (0xff < uVar159);
    puVar50[-0x16] = (uVar165 != 0) * (uVar165 < 0x100) * (char)(uVar164 >> 8) - (0xff < uVar165);
    puVar50[-0x15] = (uVar171 != 0) * (uVar171 < 0x100) * (char)(uVar170 >> 8) - (0xff < uVar171);
    puVar50[-0x14] = (uVar157 != 0) * (uVar157 < 0x100) * (char)(uVar156 >> 8) - (0xff < uVar157);
    puVar50[-0x13] = (uVar163 != 0) * (uVar163 < 0x100) * (char)(uVar162 >> 8) - (0xff < uVar163);
    puVar50[-0x12] = (uVar169 != 0) * (uVar169 < 0x100) * (char)(uVar168 >> 8) - (0xff < uVar169);
    puVar50[-0x11] = (uVar173 != 0) * (uVar173 < 0x100) * (char)(uVar172 >> 8) - (0xff < uVar173);
    uVar103 = sVar118 * uVar80 + sVar119;
    uVar108 = sVar122 * sVar81 + sVar123;
    uVar112 = sVar124 * sVar82 + sVar125;
    uVar116 = sVar126 * sVar83 + sVar127;
    uVar136 = sVar128 * sVar84 + sVar129;
    uVar140 = sVar130 * sVar85 + sVar131;
    uVar144 = sVar132 * sVar86 + sVar133;
    uVar148 = sVar134 * uVar105 + sVar135;
    uVar106 = uVar103 >> 8;
    uVar110 = uVar108 >> 8;
    uVar114 = uVar112 >> 8;
    uVar117 = uVar116 >> 8;
    uVar137 = uVar136 >> 8;
    uVar141 = uVar140 >> 8;
    uVar145 = uVar144 >> 8;
    uVar149 = uVar148 >> 8;
    uVar152 = sVar118 * uVar57 + sVar119;
    uVar158 = sVar122 * uVar139 + sVar123;
    uVar164 = sVar124 * uVar143 + sVar125;
    uVar170 = sVar126 * uVar147 + sVar127;
    uVar156 = sVar128 * uVar151 + sVar129;
    uVar162 = sVar130 * uVar155 + sVar131;
    uVar168 = sVar132 * uVar161 + sVar133;
    uVar172 = sVar134 * uVar167 + sVar135;
    uVar153 = uVar152 >> 8;
    uVar159 = uVar158 >> 8;
    uVar165 = uVar164 >> 8;
    uVar171 = uVar170 >> 8;
    uVar157 = uVar156 >> 8;
    uVar163 = uVar162 >> 8;
    uVar169 = uVar168 >> 8;
    uVar173 = uVar172 >> 8;
    puVar50[-0x10] = (uVar106 != 0) * (uVar106 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar106);
    puVar50[-0xf] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar108 >> 8) - (0xff < uVar110);
    puVar50[-0xe] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar112 >> 8) - (0xff < uVar114);
    puVar50[-0xd] = (uVar117 != 0) * (uVar117 < 0x100) * (char)(uVar116 >> 8) - (0xff < uVar117);
    puVar50[-0xc] = (uVar137 != 0) * (uVar137 < 0x100) * (char)(uVar136 >> 8) - (0xff < uVar137);
    puVar50[-0xb] = (uVar141 != 0) * (uVar141 < 0x100) * (char)(uVar140 >> 8) - (0xff < uVar141);
    puVar50[-10] = (uVar145 != 0) * (uVar145 < 0x100) * (char)(uVar144 >> 8) - (0xff < uVar145);
    puVar50[-9] = (uVar149 != 0) * (uVar149 < 0x100) * (char)(uVar148 >> 8) - (0xff < uVar149);
    puVar50[-8] = (uVar153 != 0) * (uVar153 < 0x100) * (char)(uVar152 >> 8) - (0xff < uVar153);
    puVar50[-7] = (uVar159 != 0) * (uVar159 < 0x100) * (char)(uVar158 >> 8) - (0xff < uVar159);
    puVar50[-6] = (uVar165 != 0) * (uVar165 < 0x100) * (char)(uVar164 >> 8) - (0xff < uVar165);
    puVar50[-5] = (uVar171 != 0) * (uVar171 < 0x100) * (char)(uVar170 >> 8) - (0xff < uVar171);
    puVar50[-4] = (uVar157 != 0) * (uVar157 < 0x100) * (char)(uVar156 >> 8) - (0xff < uVar157);
    puVar50[-3] = (uVar163 != 0) * (uVar163 < 0x100) * (char)(uVar162 >> 8) - (0xff < uVar163);
    puVar50[-2] = (uVar169 != 0) * (uVar169 < 0x100) * (char)(uVar168 >> 8) - (0xff < uVar169);
    puVar50[-1] = (uVar173 != 0) * (uVar173 < 0x100) * (char)(uVar172 >> 8) - (0xff < uVar173);
    uVar103 = sVar118 * uVar87 + sVar119;
    uVar108 = sVar122 * sVar88 + sVar123;
    uVar112 = sVar124 * sVar89 + sVar125;
    uVar116 = sVar126 * sVar90 + sVar127;
    uVar136 = sVar128 * sVar91 + sVar129;
    uVar140 = sVar130 * sVar92 + sVar131;
    uVar144 = sVar132 * sVar93 + sVar133;
    uVar148 = sVar134 * uVar98 + sVar135;
    uVar106 = uVar103 >> 8;
    uVar110 = uVar108 >> 8;
    uVar114 = uVar112 >> 8;
    uVar117 = uVar116 >> 8;
    uVar137 = uVar136 >> 8;
    uVar141 = uVar140 >> 8;
    uVar145 = uVar144 >> 8;
    uVar149 = uVar148 >> 8;
    uVar152 = sVar118 * uVar58 + sVar119;
    uVar158 = sVar122 * uVar59 + sVar123;
    uVar164 = sVar124 * uVar60 + sVar125;
    uVar170 = sVar126 * uVar61 + sVar127;
    uVar156 = sVar128 * uVar62 + sVar129;
    uVar162 = sVar130 * uVar63 + sVar131;
    uVar168 = sVar132 * uVar64 + sVar133;
    uVar172 = sVar134 * uVar65 + sVar135;
    uVar153 = uVar152 >> 8;
    uVar159 = uVar158 >> 8;
    uVar165 = uVar164 >> 8;
    uVar171 = uVar170 >> 8;
    uVar157 = uVar156 >> 8;
    uVar163 = uVar162 >> 8;
    uVar169 = uVar168 >> 8;
    uVar173 = uVar172 >> 8;
    *puVar50 = (uVar106 != 0) * (uVar106 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar106);
    puVar50[1] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar108 >> 8) - (0xff < uVar110);
    puVar50[2] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar112 >> 8) - (0xff < uVar114);
    puVar50[3] = (uVar117 != 0) * (uVar117 < 0x100) * (char)(uVar116 >> 8) - (0xff < uVar117);
    puVar50[4] = (uVar137 != 0) * (uVar137 < 0x100) * (char)(uVar136 >> 8) - (0xff < uVar137);
    puVar50[5] = (uVar141 != 0) * (uVar141 < 0x100) * (char)(uVar140 >> 8) - (0xff < uVar141);
    puVar50[6] = (uVar145 != 0) * (uVar145 < 0x100) * (char)(uVar144 >> 8) - (0xff < uVar145);
    puVar50[7] = (uVar149 != 0) * (uVar149 < 0x100) * (char)(uVar148 >> 8) - (0xff < uVar149);
    puVar50[8] = (uVar153 != 0) * (uVar153 < 0x100) * (char)(uVar152 >> 8) - (0xff < uVar153);
    puVar50[9] = (uVar159 != 0) * (uVar159 < 0x100) * (char)(uVar158 >> 8) - (0xff < uVar159);
    puVar50[10] = (uVar165 != 0) * (uVar165 < 0x100) * (char)(uVar164 >> 8) - (0xff < uVar165);
    puVar50[0xb] = (uVar171 != 0) * (uVar171 < 0x100) * (char)(uVar170 >> 8) - (0xff < uVar171);
    puVar50[0xc] = (uVar157 != 0) * (uVar157 < 0x100) * (char)(uVar156 >> 8) - (0xff < uVar157);
    puVar50[0xd] = (uVar163 != 0) * (uVar163 < 0x100) * (char)(uVar162 >> 8) - (0xff < uVar163);
    puVar50[0xe] = (uVar169 != 0) * (uVar169 < 0x100) * (char)(uVar168 >> 8) - (0xff < uVar169);
    puVar50[0xf] = (uVar173 != 0) * (uVar173 < 0x100) * (char)(uVar172 >> 8) - (0xff < uVar173);
    puVar50 = puVar50 + stride;
  }
  for (uVar49 = 0x1000100; auVar97 = _DAT_0046db70, uVar49 < 0xf0e0f0f; uVar49 = uVar49 + 0x2020202)
  {
    auVar95._4_4_ = uVar49;
    auVar95._0_4_ = uVar49;
    auVar95._8_4_ = uVar49;
    auVar95._12_4_ = uVar49;
    auVar97 = pshufb(auVar102,auVar95);
    auVar121 = pshufb(auVar52,auVar95);
    sVar118 = auVar97._0_2_;
    sVar122 = auVar97._2_2_;
    sVar124 = auVar97._4_2_;
    sVar126 = auVar97._6_2_;
    sVar128 = auVar97._8_2_;
    sVar130 = auVar97._10_2_;
    sVar132 = auVar97._12_2_;
    sVar134 = auVar97._14_2_;
    sVar119 = auVar121._0_2_ + 0x80;
    sVar123 = auVar121._2_2_ + 0x80;
    sVar125 = auVar121._4_2_ + 0x80;
    sVar127 = auVar121._6_2_ + 0x80;
    sVar129 = auVar121._8_2_ + 0x80;
    sVar131 = auVar121._10_2_ + 0x80;
    sVar133 = auVar121._12_2_ + 0x80;
    sVar135 = auVar121._14_2_ + 0x80;
    uVar103 = sVar118 * uVar66 + sVar119;
    uVar108 = sVar122 * sVar67 + sVar123;
    uVar112 = sVar124 * sVar68 + sVar125;
    uVar116 = sVar126 * sVar69 + sVar127;
    uVar136 = sVar128 * sVar70 + sVar129;
    uVar140 = sVar130 * sVar71 + sVar131;
    uVar144 = sVar132 * sVar72 + sVar133;
    uVar148 = sVar134 * uVar99 + sVar135;
    uVar106 = uVar103 >> 8;
    uVar110 = uVar108 >> 8;
    uVar114 = uVar112 >> 8;
    uVar117 = uVar116 >> 8;
    uVar137 = uVar136 >> 8;
    uVar141 = uVar140 >> 8;
    uVar145 = uVar144 >> 8;
    uVar149 = uVar148 >> 8;
    uVar152 = sVar118 * uVar55 + sVar119;
    uVar158 = sVar122 * uVar100 + sVar123;
    uVar164 = sVar124 * uVar104 + sVar125;
    uVar170 = sVar126 * uVar107 + sVar127;
    uVar156 = sVar128 * uVar109 + sVar129;
    uVar162 = sVar130 * uVar111 + sVar131;
    uVar168 = sVar132 * uVar113 + sVar133;
    uVar172 = sVar134 * uVar115 + sVar135;
    uVar153 = uVar152 >> 8;
    uVar159 = uVar158 >> 8;
    uVar165 = uVar164 >> 8;
    uVar171 = uVar170 >> 8;
    uVar157 = uVar156 >> 8;
    uVar163 = uVar162 >> 8;
    uVar169 = uVar168 >> 8;
    uVar173 = uVar172 >> 8;
    puVar50[-0x30] = (uVar106 != 0) * (uVar106 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar106);
    puVar50[-0x2f] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar108 >> 8) - (0xff < uVar110);
    puVar50[-0x2e] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar112 >> 8) - (0xff < uVar114);
    puVar50[-0x2d] = (uVar117 != 0) * (uVar117 < 0x100) * (char)(uVar116 >> 8) - (0xff < uVar117);
    puVar50[-0x2c] = (uVar137 != 0) * (uVar137 < 0x100) * (char)(uVar136 >> 8) - (0xff < uVar137);
    puVar50[-0x2b] = (uVar141 != 0) * (uVar141 < 0x100) * (char)(uVar140 >> 8) - (0xff < uVar141);
    puVar50[-0x2a] = (uVar145 != 0) * (uVar145 < 0x100) * (char)(uVar144 >> 8) - (0xff < uVar145);
    puVar50[-0x29] = (uVar149 != 0) * (uVar149 < 0x100) * (char)(uVar148 >> 8) - (0xff < uVar149);
    puVar50[-0x28] = (uVar153 != 0) * (uVar153 < 0x100) * (char)(uVar152 >> 8) - (0xff < uVar153);
    puVar50[-0x27] = (uVar159 != 0) * (uVar159 < 0x100) * (char)(uVar158 >> 8) - (0xff < uVar159);
    puVar50[-0x26] = (uVar165 != 0) * (uVar165 < 0x100) * (char)(uVar164 >> 8) - (0xff < uVar165);
    puVar50[-0x25] = (uVar171 != 0) * (uVar171 < 0x100) * (char)(uVar170 >> 8) - (0xff < uVar171);
    puVar50[-0x24] = (uVar157 != 0) * (uVar157 < 0x100) * (char)(uVar156 >> 8) - (0xff < uVar157);
    puVar50[-0x23] = (uVar163 != 0) * (uVar163 < 0x100) * (char)(uVar162 >> 8) - (0xff < uVar163);
    puVar50[-0x22] = (uVar169 != 0) * (uVar169 < 0x100) * (char)(uVar168 >> 8) - (0xff < uVar169);
    puVar50[-0x21] = (uVar173 != 0) * (uVar173 < 0x100) * (char)(uVar172 >> 8) - (0xff < uVar173);
    uVar103 = sVar118 * uVar73 + sVar119;
    uVar108 = sVar122 * sVar74 + sVar123;
    uVar112 = sVar124 * sVar75 + sVar125;
    uVar116 = sVar126 * sVar76 + sVar127;
    uVar136 = sVar128 * sVar77 + sVar129;
    uVar140 = sVar130 * sVar78 + sVar131;
    uVar144 = sVar132 * sVar79 + sVar133;
    uVar148 = sVar134 * uVar101 + sVar135;
    uVar106 = uVar103 >> 8;
    uVar110 = uVar108 >> 8;
    uVar114 = uVar112 >> 8;
    uVar117 = uVar116 >> 8;
    uVar137 = uVar136 >> 8;
    uVar141 = uVar140 >> 8;
    uVar145 = uVar144 >> 8;
    uVar149 = uVar148 >> 8;
    uVar152 = sVar118 * uVar56 + sVar119;
    uVar158 = sVar122 * uVar138 + sVar123;
    uVar164 = sVar124 * uVar142 + sVar125;
    uVar170 = sVar126 * uVar146 + sVar127;
    uVar156 = sVar128 * uVar150 + sVar129;
    uVar162 = sVar130 * uVar154 + sVar131;
    uVar168 = sVar132 * uVar160 + sVar133;
    uVar172 = sVar134 * uVar166 + sVar135;
    uVar153 = uVar152 >> 8;
    uVar159 = uVar158 >> 8;
    uVar165 = uVar164 >> 8;
    uVar171 = uVar170 >> 8;
    uVar157 = uVar156 >> 8;
    uVar163 = uVar162 >> 8;
    uVar169 = uVar168 >> 8;
    uVar173 = uVar172 >> 8;
    puVar50[-0x20] = (uVar106 != 0) * (uVar106 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar106);
    puVar50[-0x1f] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar108 >> 8) - (0xff < uVar110);
    puVar50[-0x1e] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar112 >> 8) - (0xff < uVar114);
    puVar50[-0x1d] = (uVar117 != 0) * (uVar117 < 0x100) * (char)(uVar116 >> 8) - (0xff < uVar117);
    puVar50[-0x1c] = (uVar137 != 0) * (uVar137 < 0x100) * (char)(uVar136 >> 8) - (0xff < uVar137);
    puVar50[-0x1b] = (uVar141 != 0) * (uVar141 < 0x100) * (char)(uVar140 >> 8) - (0xff < uVar141);
    puVar50[-0x1a] = (uVar145 != 0) * (uVar145 < 0x100) * (char)(uVar144 >> 8) - (0xff < uVar145);
    puVar50[-0x19] = (uVar149 != 0) * (uVar149 < 0x100) * (char)(uVar148 >> 8) - (0xff < uVar149);
    puVar50[-0x18] = (uVar153 != 0) * (uVar153 < 0x100) * (char)(uVar152 >> 8) - (0xff < uVar153);
    puVar50[-0x17] = (uVar159 != 0) * (uVar159 < 0x100) * (char)(uVar158 >> 8) - (0xff < uVar159);
    puVar50[-0x16] = (uVar165 != 0) * (uVar165 < 0x100) * (char)(uVar164 >> 8) - (0xff < uVar165);
    puVar50[-0x15] = (uVar171 != 0) * (uVar171 < 0x100) * (char)(uVar170 >> 8) - (0xff < uVar171);
    puVar50[-0x14] = (uVar157 != 0) * (uVar157 < 0x100) * (char)(uVar156 >> 8) - (0xff < uVar157);
    puVar50[-0x13] = (uVar163 != 0) * (uVar163 < 0x100) * (char)(uVar162 >> 8) - (0xff < uVar163);
    puVar50[-0x12] = (uVar169 != 0) * (uVar169 < 0x100) * (char)(uVar168 >> 8) - (0xff < uVar169);
    puVar50[-0x11] = (uVar173 != 0) * (uVar173 < 0x100) * (char)(uVar172 >> 8) - (0xff < uVar173);
    uVar103 = sVar118 * uVar80 + sVar119;
    uVar108 = sVar122 * sVar81 + sVar123;
    uVar112 = sVar124 * sVar82 + sVar125;
    uVar116 = sVar126 * sVar83 + sVar127;
    uVar136 = sVar128 * sVar84 + sVar129;
    uVar140 = sVar130 * sVar85 + sVar131;
    uVar144 = sVar132 * sVar86 + sVar133;
    uVar148 = sVar134 * uVar105 + sVar135;
    uVar106 = uVar103 >> 8;
    uVar110 = uVar108 >> 8;
    uVar114 = uVar112 >> 8;
    uVar117 = uVar116 >> 8;
    uVar137 = uVar136 >> 8;
    uVar141 = uVar140 >> 8;
    uVar145 = uVar144 >> 8;
    uVar149 = uVar148 >> 8;
    uVar152 = sVar118 * uVar57 + sVar119;
    uVar158 = sVar122 * uVar139 + sVar123;
    uVar164 = sVar124 * uVar143 + sVar125;
    uVar170 = sVar126 * uVar147 + sVar127;
    uVar156 = sVar128 * uVar151 + sVar129;
    uVar162 = sVar130 * uVar155 + sVar131;
    uVar168 = sVar132 * uVar161 + sVar133;
    uVar172 = sVar134 * uVar167 + sVar135;
    uVar153 = uVar152 >> 8;
    uVar159 = uVar158 >> 8;
    uVar165 = uVar164 >> 8;
    uVar171 = uVar170 >> 8;
    uVar157 = uVar156 >> 8;
    uVar163 = uVar162 >> 8;
    uVar169 = uVar168 >> 8;
    uVar173 = uVar172 >> 8;
    puVar50[-0x10] = (uVar106 != 0) * (uVar106 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar106);
    puVar50[-0xf] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar108 >> 8) - (0xff < uVar110);
    puVar50[-0xe] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar112 >> 8) - (0xff < uVar114);
    puVar50[-0xd] = (uVar117 != 0) * (uVar117 < 0x100) * (char)(uVar116 >> 8) - (0xff < uVar117);
    puVar50[-0xc] = (uVar137 != 0) * (uVar137 < 0x100) * (char)(uVar136 >> 8) - (0xff < uVar137);
    puVar50[-0xb] = (uVar141 != 0) * (uVar141 < 0x100) * (char)(uVar140 >> 8) - (0xff < uVar141);
    puVar50[-10] = (uVar145 != 0) * (uVar145 < 0x100) * (char)(uVar144 >> 8) - (0xff < uVar145);
    puVar50[-9] = (uVar149 != 0) * (uVar149 < 0x100) * (char)(uVar148 >> 8) - (0xff < uVar149);
    puVar50[-8] = (uVar153 != 0) * (uVar153 < 0x100) * (char)(uVar152 >> 8) - (0xff < uVar153);
    puVar50[-7] = (uVar159 != 0) * (uVar159 < 0x100) * (char)(uVar158 >> 8) - (0xff < uVar159);
    puVar50[-6] = (uVar165 != 0) * (uVar165 < 0x100) * (char)(uVar164 >> 8) - (0xff < uVar165);
    puVar50[-5] = (uVar171 != 0) * (uVar171 < 0x100) * (char)(uVar170 >> 8) - (0xff < uVar171);
    puVar50[-4] = (uVar157 != 0) * (uVar157 < 0x100) * (char)(uVar156 >> 8) - (0xff < uVar157);
    puVar50[-3] = (uVar163 != 0) * (uVar163 < 0x100) * (char)(uVar162 >> 8) - (0xff < uVar163);
    puVar50[-2] = (uVar169 != 0) * (uVar169 < 0x100) * (char)(uVar168 >> 8) - (0xff < uVar169);
    puVar50[-1] = (uVar173 != 0) * (uVar173 < 0x100) * (char)(uVar172 >> 8) - (0xff < uVar173);
    uVar103 = sVar118 * uVar87 + sVar119;
    uVar108 = sVar122 * sVar88 + sVar123;
    uVar112 = sVar124 * sVar89 + sVar125;
    uVar116 = sVar126 * sVar90 + sVar127;
    uVar136 = sVar128 * sVar91 + sVar129;
    uVar140 = sVar130 * sVar92 + sVar131;
    uVar144 = sVar132 * sVar93 + sVar133;
    uVar148 = sVar134 * uVar98 + sVar135;
    uVar106 = uVar103 >> 8;
    uVar110 = uVar108 >> 8;
    uVar114 = uVar112 >> 8;
    uVar117 = uVar116 >> 8;
    uVar137 = uVar136 >> 8;
    uVar141 = uVar140 >> 8;
    uVar145 = uVar144 >> 8;
    uVar149 = uVar148 >> 8;
    uVar152 = sVar118 * uVar58 + sVar119;
    uVar158 = sVar122 * uVar59 + sVar123;
    uVar164 = sVar124 * uVar60 + sVar125;
    uVar170 = sVar126 * uVar61 + sVar127;
    uVar156 = sVar128 * uVar62 + sVar129;
    uVar162 = sVar130 * uVar63 + sVar131;
    uVar168 = sVar132 * uVar64 + sVar133;
    uVar172 = sVar134 * uVar65 + sVar135;
    uVar153 = uVar152 >> 8;
    uVar159 = uVar158 >> 8;
    uVar165 = uVar164 >> 8;
    uVar171 = uVar170 >> 8;
    uVar157 = uVar156 >> 8;
    uVar163 = uVar162 >> 8;
    uVar169 = uVar168 >> 8;
    uVar173 = uVar172 >> 8;
    *puVar50 = (uVar106 != 0) * (uVar106 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar106);
    puVar50[1] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar108 >> 8) - (0xff < uVar110);
    puVar50[2] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar112 >> 8) - (0xff < uVar114);
    puVar50[3] = (uVar117 != 0) * (uVar117 < 0x100) * (char)(uVar116 >> 8) - (0xff < uVar117);
    puVar50[4] = (uVar137 != 0) * (uVar137 < 0x100) * (char)(uVar136 >> 8) - (0xff < uVar137);
    puVar50[5] = (uVar141 != 0) * (uVar141 < 0x100) * (char)(uVar140 >> 8) - (0xff < uVar141);
    puVar50[6] = (uVar145 != 0) * (uVar145 < 0x100) * (char)(uVar144 >> 8) - (0xff < uVar145);
    puVar50[7] = (uVar149 != 0) * (uVar149 < 0x100) * (char)(uVar148 >> 8) - (0xff < uVar149);
    puVar50[8] = (uVar153 != 0) * (uVar153 < 0x100) * (char)(uVar152 >> 8) - (0xff < uVar153);
    puVar50[9] = (uVar159 != 0) * (uVar159 < 0x100) * (char)(uVar158 >> 8) - (0xff < uVar159);
    puVar50[10] = (uVar165 != 0) * (uVar165 < 0x100) * (char)(uVar164 >> 8) - (0xff < uVar165);
    puVar50[0xb] = (uVar171 != 0) * (uVar171 < 0x100) * (char)(uVar170 >> 8) - (0xff < uVar171);
    puVar50[0xc] = (uVar157 != 0) * (uVar157 < 0x100) * (char)(uVar156 >> 8) - (0xff < uVar157);
    puVar50[0xd] = (uVar163 != 0) * (uVar163 < 0x100) * (char)(uVar162 >> 8) - (0xff < uVar163);
    puVar50[0xe] = (uVar169 != 0) * (uVar169 < 0x100) * (char)(uVar168 >> 8) - (0xff < uVar169);
    puVar50[0xf] = (uVar173 != 0) * (uVar173 < 0x100) * (char)(uVar172 >> 8) - (0xff < uVar173);
    puVar50 = puVar50 + stride;
  }
  for (uVar49 = 0x1000100; uVar49 < 0xf0e0f0f; uVar49 = uVar49 + 0x2020202) {
    auVar121._4_4_ = uVar49;
    auVar121._0_4_ = uVar49;
    auVar121._8_4_ = uVar49;
    auVar121._12_4_ = uVar49;
    auVar95 = pshufb(auVar97,auVar121);
    auVar102._2_2_ = sVar54 * 0xef;
    auVar102._0_2_ = sVar51 * 0xeb;
    auVar102._4_2_ = sVar51 * 0xf2;
    auVar102._6_2_ = sVar54 * 0xf4;
    auVar102._8_2_ = sVar51 * 0xf6;
    auVar102._10_2_ = sVar54 * 0xf7;
    auVar102._12_2_ = sVar51 * 0xf8;
    auVar102._14_2_ = sVar54 * 0xf8;
    auVar102 = pshufb(auVar102,auVar121);
    sVar118 = auVar95._0_2_;
    sVar122 = auVar95._2_2_;
    sVar124 = auVar95._4_2_;
    sVar126 = auVar95._6_2_;
    sVar128 = auVar95._8_2_;
    sVar130 = auVar95._10_2_;
    sVar132 = auVar95._12_2_;
    sVar134 = auVar95._14_2_;
    sVar119 = auVar102._0_2_ + 0x80;
    sVar123 = auVar102._2_2_ + 0x80;
    sVar125 = auVar102._4_2_ + 0x80;
    sVar127 = auVar102._6_2_ + 0x80;
    sVar129 = auVar102._8_2_ + 0x80;
    sVar131 = auVar102._10_2_ + 0x80;
    sVar133 = auVar102._12_2_ + 0x80;
    sVar135 = auVar102._14_2_ + 0x80;
    uVar103 = sVar118 * uVar66 + sVar119;
    uVar108 = sVar122 * sVar67 + sVar123;
    uVar112 = sVar124 * sVar68 + sVar125;
    uVar116 = sVar126 * sVar69 + sVar127;
    uVar136 = sVar128 * sVar70 + sVar129;
    uVar140 = sVar130 * sVar71 + sVar131;
    uVar144 = sVar132 * sVar72 + sVar133;
    uVar148 = sVar134 * uVar99 + sVar135;
    uVar106 = uVar103 >> 8;
    uVar110 = uVar108 >> 8;
    uVar114 = uVar112 >> 8;
    uVar117 = uVar116 >> 8;
    uVar137 = uVar136 >> 8;
    uVar141 = uVar140 >> 8;
    uVar145 = uVar144 >> 8;
    uVar149 = uVar148 >> 8;
    uVar152 = sVar118 * uVar55 + sVar119;
    uVar158 = sVar122 * uVar100 + sVar123;
    uVar164 = sVar124 * uVar104 + sVar125;
    uVar170 = sVar126 * uVar107 + sVar127;
    uVar156 = sVar128 * uVar109 + sVar129;
    uVar162 = sVar130 * uVar111 + sVar131;
    uVar168 = sVar132 * uVar113 + sVar133;
    uVar172 = sVar134 * uVar115 + sVar135;
    uVar153 = uVar152 >> 8;
    uVar159 = uVar158 >> 8;
    uVar165 = uVar164 >> 8;
    uVar171 = uVar170 >> 8;
    uVar157 = uVar156 >> 8;
    uVar163 = uVar162 >> 8;
    uVar169 = uVar168 >> 8;
    uVar173 = uVar172 >> 8;
    puVar50[-0x30] = (uVar106 != 0) * (uVar106 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar106);
    puVar50[-0x2f] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar108 >> 8) - (0xff < uVar110);
    puVar50[-0x2e] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar112 >> 8) - (0xff < uVar114);
    puVar50[-0x2d] = (uVar117 != 0) * (uVar117 < 0x100) * (char)(uVar116 >> 8) - (0xff < uVar117);
    puVar50[-0x2c] = (uVar137 != 0) * (uVar137 < 0x100) * (char)(uVar136 >> 8) - (0xff < uVar137);
    puVar50[-0x2b] = (uVar141 != 0) * (uVar141 < 0x100) * (char)(uVar140 >> 8) - (0xff < uVar141);
    puVar50[-0x2a] = (uVar145 != 0) * (uVar145 < 0x100) * (char)(uVar144 >> 8) - (0xff < uVar145);
    puVar50[-0x29] = (uVar149 != 0) * (uVar149 < 0x100) * (char)(uVar148 >> 8) - (0xff < uVar149);
    puVar50[-0x28] = (uVar153 != 0) * (uVar153 < 0x100) * (char)(uVar152 >> 8) - (0xff < uVar153);
    puVar50[-0x27] = (uVar159 != 0) * (uVar159 < 0x100) * (char)(uVar158 >> 8) - (0xff < uVar159);
    puVar50[-0x26] = (uVar165 != 0) * (uVar165 < 0x100) * (char)(uVar164 >> 8) - (0xff < uVar165);
    puVar50[-0x25] = (uVar171 != 0) * (uVar171 < 0x100) * (char)(uVar170 >> 8) - (0xff < uVar171);
    puVar50[-0x24] = (uVar157 != 0) * (uVar157 < 0x100) * (char)(uVar156 >> 8) - (0xff < uVar157);
    puVar50[-0x23] = (uVar163 != 0) * (uVar163 < 0x100) * (char)(uVar162 >> 8) - (0xff < uVar163);
    puVar50[-0x22] = (uVar169 != 0) * (uVar169 < 0x100) * (char)(uVar168 >> 8) - (0xff < uVar169);
    puVar50[-0x21] = (uVar173 != 0) * (uVar173 < 0x100) * (char)(uVar172 >> 8) - (0xff < uVar173);
    uVar103 = sVar118 * uVar73 + sVar119;
    uVar108 = sVar122 * sVar74 + sVar123;
    uVar112 = sVar124 * sVar75 + sVar125;
    uVar116 = sVar126 * sVar76 + sVar127;
    uVar136 = sVar128 * sVar77 + sVar129;
    uVar140 = sVar130 * sVar78 + sVar131;
    uVar144 = sVar132 * sVar79 + sVar133;
    uVar148 = sVar134 * uVar101 + sVar135;
    uVar106 = uVar103 >> 8;
    uVar110 = uVar108 >> 8;
    uVar114 = uVar112 >> 8;
    uVar117 = uVar116 >> 8;
    uVar137 = uVar136 >> 8;
    uVar141 = uVar140 >> 8;
    uVar145 = uVar144 >> 8;
    uVar149 = uVar148 >> 8;
    uVar152 = sVar118 * uVar56 + sVar119;
    uVar158 = sVar122 * uVar138 + sVar123;
    uVar164 = sVar124 * uVar142 + sVar125;
    uVar170 = sVar126 * uVar146 + sVar127;
    uVar156 = sVar128 * uVar150 + sVar129;
    uVar162 = sVar130 * uVar154 + sVar131;
    uVar168 = sVar132 * uVar160 + sVar133;
    uVar172 = sVar134 * uVar166 + sVar135;
    uVar153 = uVar152 >> 8;
    uVar159 = uVar158 >> 8;
    uVar165 = uVar164 >> 8;
    uVar171 = uVar170 >> 8;
    uVar157 = uVar156 >> 8;
    uVar163 = uVar162 >> 8;
    uVar169 = uVar168 >> 8;
    uVar173 = uVar172 >> 8;
    puVar50[-0x20] = (uVar106 != 0) * (uVar106 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar106);
    puVar50[-0x1f] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar108 >> 8) - (0xff < uVar110);
    puVar50[-0x1e] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar112 >> 8) - (0xff < uVar114);
    puVar50[-0x1d] = (uVar117 != 0) * (uVar117 < 0x100) * (char)(uVar116 >> 8) - (0xff < uVar117);
    puVar50[-0x1c] = (uVar137 != 0) * (uVar137 < 0x100) * (char)(uVar136 >> 8) - (0xff < uVar137);
    puVar50[-0x1b] = (uVar141 != 0) * (uVar141 < 0x100) * (char)(uVar140 >> 8) - (0xff < uVar141);
    puVar50[-0x1a] = (uVar145 != 0) * (uVar145 < 0x100) * (char)(uVar144 >> 8) - (0xff < uVar145);
    puVar50[-0x19] = (uVar149 != 0) * (uVar149 < 0x100) * (char)(uVar148 >> 8) - (0xff < uVar149);
    puVar50[-0x18] = (uVar153 != 0) * (uVar153 < 0x100) * (char)(uVar152 >> 8) - (0xff < uVar153);
    puVar50[-0x17] = (uVar159 != 0) * (uVar159 < 0x100) * (char)(uVar158 >> 8) - (0xff < uVar159);
    puVar50[-0x16] = (uVar165 != 0) * (uVar165 < 0x100) * (char)(uVar164 >> 8) - (0xff < uVar165);
    puVar50[-0x15] = (uVar171 != 0) * (uVar171 < 0x100) * (char)(uVar170 >> 8) - (0xff < uVar171);
    puVar50[-0x14] = (uVar157 != 0) * (uVar157 < 0x100) * (char)(uVar156 >> 8) - (0xff < uVar157);
    puVar50[-0x13] = (uVar163 != 0) * (uVar163 < 0x100) * (char)(uVar162 >> 8) - (0xff < uVar163);
    puVar50[-0x12] = (uVar169 != 0) * (uVar169 < 0x100) * (char)(uVar168 >> 8) - (0xff < uVar169);
    puVar50[-0x11] = (uVar173 != 0) * (uVar173 < 0x100) * (char)(uVar172 >> 8) - (0xff < uVar173);
    uVar103 = sVar118 * uVar80 + sVar119;
    uVar108 = sVar122 * sVar81 + sVar123;
    uVar112 = sVar124 * sVar82 + sVar125;
    uVar116 = sVar126 * sVar83 + sVar127;
    uVar136 = sVar128 * sVar84 + sVar129;
    uVar140 = sVar130 * sVar85 + sVar131;
    uVar144 = sVar132 * sVar86 + sVar133;
    uVar148 = sVar134 * uVar105 + sVar135;
    uVar106 = uVar103 >> 8;
    uVar110 = uVar108 >> 8;
    uVar114 = uVar112 >> 8;
    uVar117 = uVar116 >> 8;
    uVar137 = uVar136 >> 8;
    uVar141 = uVar140 >> 8;
    uVar145 = uVar144 >> 8;
    uVar149 = uVar148 >> 8;
    uVar152 = sVar118 * uVar57 + sVar119;
    uVar158 = sVar122 * uVar139 + sVar123;
    uVar164 = sVar124 * uVar143 + sVar125;
    uVar170 = sVar126 * uVar147 + sVar127;
    uVar156 = sVar128 * uVar151 + sVar129;
    uVar162 = sVar130 * uVar155 + sVar131;
    uVar168 = sVar132 * uVar161 + sVar133;
    uVar172 = sVar134 * uVar167 + sVar135;
    uVar153 = uVar152 >> 8;
    uVar159 = uVar158 >> 8;
    uVar165 = uVar164 >> 8;
    uVar171 = uVar170 >> 8;
    uVar157 = uVar156 >> 8;
    uVar163 = uVar162 >> 8;
    uVar169 = uVar168 >> 8;
    uVar173 = uVar172 >> 8;
    puVar50[-0x10] = (uVar106 != 0) * (uVar106 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar106);
    puVar50[-0xf] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar108 >> 8) - (0xff < uVar110);
    puVar50[-0xe] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar112 >> 8) - (0xff < uVar114);
    puVar50[-0xd] = (uVar117 != 0) * (uVar117 < 0x100) * (char)(uVar116 >> 8) - (0xff < uVar117);
    puVar50[-0xc] = (uVar137 != 0) * (uVar137 < 0x100) * (char)(uVar136 >> 8) - (0xff < uVar137);
    puVar50[-0xb] = (uVar141 != 0) * (uVar141 < 0x100) * (char)(uVar140 >> 8) - (0xff < uVar141);
    puVar50[-10] = (uVar145 != 0) * (uVar145 < 0x100) * (char)(uVar144 >> 8) - (0xff < uVar145);
    puVar50[-9] = (uVar149 != 0) * (uVar149 < 0x100) * (char)(uVar148 >> 8) - (0xff < uVar149);
    puVar50[-8] = (uVar153 != 0) * (uVar153 < 0x100) * (char)(uVar152 >> 8) - (0xff < uVar153);
    puVar50[-7] = (uVar159 != 0) * (uVar159 < 0x100) * (char)(uVar158 >> 8) - (0xff < uVar159);
    puVar50[-6] = (uVar165 != 0) * (uVar165 < 0x100) * (char)(uVar164 >> 8) - (0xff < uVar165);
    puVar50[-5] = (uVar171 != 0) * (uVar171 < 0x100) * (char)(uVar170 >> 8) - (0xff < uVar171);
    puVar50[-4] = (uVar157 != 0) * (uVar157 < 0x100) * (char)(uVar156 >> 8) - (0xff < uVar157);
    puVar50[-3] = (uVar163 != 0) * (uVar163 < 0x100) * (char)(uVar162 >> 8) - (0xff < uVar163);
    puVar50[-2] = (uVar169 != 0) * (uVar169 < 0x100) * (char)(uVar168 >> 8) - (0xff < uVar169);
    puVar50[-1] = (uVar173 != 0) * (uVar173 < 0x100) * (char)(uVar172 >> 8) - (0xff < uVar173);
    uVar103 = sVar118 * uVar87 + sVar119;
    uVar108 = sVar122 * sVar88 + sVar123;
    uVar112 = sVar124 * sVar89 + sVar125;
    uVar116 = sVar126 * sVar90 + sVar127;
    uVar136 = sVar128 * sVar91 + sVar129;
    uVar140 = sVar130 * sVar92 + sVar131;
    uVar144 = sVar132 * sVar93 + sVar133;
    uVar148 = sVar134 * uVar98 + sVar135;
    uVar106 = uVar103 >> 8;
    uVar110 = uVar108 >> 8;
    uVar114 = uVar112 >> 8;
    uVar117 = uVar116 >> 8;
    uVar137 = uVar136 >> 8;
    uVar141 = uVar140 >> 8;
    uVar145 = uVar144 >> 8;
    uVar149 = uVar148 >> 8;
    uVar152 = sVar118 * uVar58 + sVar119;
    uVar158 = sVar122 * uVar59 + sVar123;
    uVar164 = sVar124 * uVar60 + sVar125;
    uVar170 = sVar126 * uVar61 + sVar127;
    uVar156 = sVar128 * uVar62 + sVar129;
    uVar162 = sVar130 * uVar63 + sVar131;
    uVar168 = sVar132 * uVar64 + sVar133;
    uVar172 = sVar134 * uVar65 + sVar135;
    uVar153 = uVar152 >> 8;
    uVar159 = uVar158 >> 8;
    uVar165 = uVar164 >> 8;
    uVar171 = uVar170 >> 8;
    uVar157 = uVar156 >> 8;
    uVar163 = uVar162 >> 8;
    uVar169 = uVar168 >> 8;
    uVar173 = uVar172 >> 8;
    *puVar50 = (uVar106 != 0) * (uVar106 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar106);
    puVar50[1] = (uVar110 != 0) * (uVar110 < 0x100) * (char)(uVar108 >> 8) - (0xff < uVar110);
    puVar50[2] = (uVar114 != 0) * (uVar114 < 0x100) * (char)(uVar112 >> 8) - (0xff < uVar114);
    puVar50[3] = (uVar117 != 0) * (uVar117 < 0x100) * (char)(uVar116 >> 8) - (0xff < uVar117);
    puVar50[4] = (uVar137 != 0) * (uVar137 < 0x100) * (char)(uVar136 >> 8) - (0xff < uVar137);
    puVar50[5] = (uVar141 != 0) * (uVar141 < 0x100) * (char)(uVar140 >> 8) - (0xff < uVar141);
    puVar50[6] = (uVar145 != 0) * (uVar145 < 0x100) * (char)(uVar144 >> 8) - (0xff < uVar145);
    puVar50[7] = (uVar149 != 0) * (uVar149 < 0x100) * (char)(uVar148 >> 8) - (0xff < uVar149);
    puVar50[8] = (uVar153 != 0) * (uVar153 < 0x100) * (char)(uVar152 >> 8) - (0xff < uVar153);
    puVar50[9] = (uVar159 != 0) * (uVar159 < 0x100) * (char)(uVar158 >> 8) - (0xff < uVar159);
    puVar50[10] = (uVar165 != 0) * (uVar165 < 0x100) * (char)(uVar164 >> 8) - (0xff < uVar165);
    puVar50[0xb] = (uVar171 != 0) * (uVar171 < 0x100) * (char)(uVar170 >> 8) - (0xff < uVar171);
    puVar50[0xc] = (uVar157 != 0) * (uVar157 < 0x100) * (char)(uVar156 >> 8) - (0xff < uVar157);
    puVar50[0xd] = (uVar163 != 0) * (uVar163 < 0x100) * (char)(uVar162 >> 8) - (0xff < uVar163);
    puVar50[0xe] = (uVar169 != 0) * (uVar169 < 0x100) * (char)(uVar168 >> 8) - (0xff < uVar169);
    puVar50[0xf] = (uVar173 != 0) * (uVar173 < 0x100) * (char)(uVar172 >> 8) - (0xff < uVar173);
    puVar50 = puVar50 + stride;
  }
  return;
}

Assistant:

void aom_smooth_v_predictor_64x32_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i bottom_left = _mm_set1_epi16(left_column[31]);
  const __m128i top_lolo = LoadUnaligned16(top_row);
  const __m128i top_lohi = LoadUnaligned16(top_row + 16);
  const __m128i top1 = cvtepu8_epi16(top_lolo);
  const __m128i top2 = _mm_unpackhi_epi8(top_lolo, zero);
  const __m128i top3 = cvtepu8_epi16(top_lohi);
  const __m128i top4 = _mm_unpackhi_epi8(top_lohi, zero);
  const __m128i top_hilo = LoadUnaligned16(top_row + 32);
  const __m128i top_hihi = LoadUnaligned16(top_row + 48);
  const __m128i top5 = cvtepu8_epi16(top_hilo);
  const __m128i top6 = _mm_unpackhi_epi8(top_hilo, zero);
  const __m128i top7 = cvtepu8_epi16(top_hihi);
  const __m128i top8 = _mm_unpackhi_epi8(top_hihi, zero);
  const __m128i weights_lo = LoadUnaligned16(smooth_weights + 28);
  const __m128i weights_hi = LoadUnaligned16(smooth_weights + 44);
  const __m128i weights1 = cvtepu8_epi16(weights_lo);
  const __m128i weights2 = _mm_unpackhi_epi8(weights_lo, zero);
  const __m128i weights3 = cvtepu8_epi16(weights_hi);
  const __m128i weights4 = _mm_unpackhi_epi8(weights_hi, zero);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i inverted_weights1 = _mm_sub_epi16(scale, weights1);
  const __m128i inverted_weights2 = _mm_sub_epi16(scale, weights2);
  const __m128i inverted_weights3 = _mm_sub_epi16(scale, weights3);
  const __m128i inverted_weights4 = _mm_sub_epi16(scale, weights4);
  const __m128i scaled_bottom_left1 =
      _mm_mullo_epi16(inverted_weights1, bottom_left);
  const __m128i scaled_bottom_left2 =
      _mm_mullo_epi16(inverted_weights2, bottom_left);
  const __m128i scaled_bottom_left3 =
      _mm_mullo_epi16(inverted_weights3, bottom_left);
  const __m128i scaled_bottom_left4 =
      _mm_mullo_epi16(inverted_weights4, bottom_left);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));

  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights1, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left1, y_select);
    write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 32, top5, top6, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 48, top7, top8, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights2, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left2, y_select);
    write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 32, top5, top6, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 48, top7, top8, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights3, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left3, y_select);
    write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 32, top5, top6, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 48, top7, top8, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights4, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left4, y_select);
    write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 32, top5, top6, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 48, top7, top8, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
}